

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase135::run(TestCase135 *this)

{
  bool bVar1;
  size_t in_RSI;
  Array<kj::(anonymous_namespace)::TestObject> array;
  Runnable local_188;
  Array<kj::(anonymous_namespace)::TestObject> *local_180;
  NullableValue<kj::Exception> local_178;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  heapArray<kj::(anonymous_namespace)::TestObject>(&array,in_RSI);
  if (((anonymous_namespace)::TestObject::count != 0x20) && (_::Debug::minSeverity < 3)) {
    local_178.isSet = true;
    local_178._1_3_ = 0;
    _::Debug::log<char_const(&)[45],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x8c,ERROR,
               "\"failed: expected \" \"(32) == (TestObject::count)\", 32, TestObject::count",
               (char (*) [45])"failed: expected (32) == (TestObject::count)",(int *)&local_178,
               &(anonymous_namespace)::TestObject::count);
  }
  (anonymous_namespace)::TestObject::throwAt = 0x10;
  local_188._vptr_Runnable = (_func_int **)&PTR_run_001c5b00;
  local_180 = &array;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_178,&local_188);
  bVar1 = local_178.isSet;
  _::NullableValue<kj::Exception>::~NullableValue(&local_178);
  if (_::Debug::minSeverity < 3 && bVar1 == false) {
    _::Debug::log<char_const(&)[84]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x90,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { array = nullptr; }) != nullptr\""
               ,(char (*) [84])
                "failed: expected ::kj::runCatchingExceptions([&]() { array = nullptr; }) != nullptr"
              );
  }
  if (((anonymous_namespace)::TestObject::count != 0) && (_::Debug::minSeverity < 3)) {
    local_178.isSet = false;
    local_178._1_3_ = 0;
    _::Debug::log<char_const(&)[44],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x91,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", 0, TestObject::count",
               (char (*) [44])"failed: expected (0) == (TestObject::count)",(int *)&local_178,
               &(anonymous_namespace)::TestObject::count);
  }
  Array<kj::(anonymous_namespace)::TestObject>::~Array(&array);
  return;
}

Assistant:

TEST(Array, ThrowingDestructor) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Array<TestObject> array = heapArray<TestObject>(32);
  EXPECT_EQ(32, TestObject::count);

  // If a destructor throws, all elements should still be destroyed.
  TestObject::throwAt = 16;
  EXPECT_ANY_THROW(array = nullptr);
  EXPECT_EQ(0, TestObject::count);
}